

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O2

void assert_throws_macro_passes_pointer_type(void)

{
  string *this;
  undefined8 *puVar1;
  allocator local_19;
  
  this = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this,"pointer_throwing_function test",&local_19);
  exception_pointer_abi_cxx11_ = this;
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = exception_pointer_abi_cxx11_;
  __cxa_throw(puVar1,&std::__cxx11::string*::typeinfo,0);
}

Assistant:

static void pointer_throwing_function(void) {
    exception_pointer = new std::string("pointer_throwing_function test");
    throw exception_pointer;
}